

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlerror.cpp
# Opt level: O3

QDebug operator<<(QDebug dbg,QSqlError *s)

{
  QArrayData *pQVar1;
  QArrayData *pQVar2;
  QArrayData *pQVar3;
  long *in_RDX;
  QSqlErrorPrivate *pQVar4;
  undefined8 *puVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QDebugStateSaver saver;
  undefined8 local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = 0xaaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)s);
  pQVar4 = (s->d).d.ptr;
  *(undefined1 *)&(pQVar4->databaseError).d.size = 0;
  QVar6.m_data = (storage_type *)0xa;
  QVar6.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar6);
  QTextStream::operator<<((QTextStream *)pQVar4,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar4 = (s->d).d.ptr;
  if ((char)(pQVar4->databaseError).d.size == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar4,' ');
  }
  pQVar1 = *(QArrayData **)(*in_RDX + 0x40);
  puVar5 = *(undefined8 **)(*in_RDX + 0x48);
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (puVar5 == (undefined8 *)0x0) {
    puVar5 = &QString::_empty;
  }
  QDebug::putString((QChar *)s,(ulong)puVar5);
  pQVar4 = (s->d).d.ptr;
  if ((char)(pQVar4->databaseError).d.size == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar4,' ');
    pQVar4 = (s->d).d.ptr;
  }
  QVar7.m_data = (storage_type *)0x2;
  QVar7.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar7);
  QTextStream::operator<<((QTextStream *)pQVar4,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar4 = (s->d).d.ptr;
  if ((char)(pQVar4->databaseError).d.size == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar4,' ');
  }
  pQVar2 = *(QArrayData **)(*in_RDX + 8);
  puVar5 = *(undefined8 **)(*in_RDX + 0x10);
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (puVar5 == (undefined8 *)0x0) {
    puVar5 = &QString::_empty;
  }
  QDebug::putString((QChar *)s,(ulong)puVar5);
  pQVar4 = (s->d).d.ptr;
  if ((char)(pQVar4->databaseError).d.size == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar4,' ');
    pQVar4 = (s->d).d.ptr;
  }
  QVar8.m_data = (storage_type *)0x2;
  QVar8.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar8);
  QTextStream::operator<<((QTextStream *)pQVar4,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar4 = (s->d).d.ptr;
  if ((char)(pQVar4->databaseError).d.size == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar4,' ');
  }
  pQVar3 = *(QArrayData **)(*in_RDX + 0x20);
  puVar5 = *(undefined8 **)(*in_RDX + 0x28);
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (puVar5 == (undefined8 *)0x0) {
    puVar5 = &QString::_empty;
  }
  QDebug::putString((QChar *)s,(ulong)puVar5);
  pQVar4 = (s->d).d.ptr;
  if ((char)(pQVar4->databaseError).d.size == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar4,' ');
    pQVar4 = (s->d).d.ptr;
  }
  QTextStream::operator<<((QTextStream *)pQVar4,')');
  pQVar4 = (s->d).d.ptr;
  if ((char)(pQVar4->databaseError).d.size == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar4,' ');
  }
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
    }
  }
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  pQVar4 = (s->d).d.ptr;
  (s->d).d.ptr = (QSqlErrorPrivate *)0x0;
  *(QSqlErrorPrivate **)dbg.stream = pQVar4;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)dbg.stream;
}

Assistant:

QDebug operator<<(QDebug dbg, const QSqlError &s)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    dbg << "QSqlError(" << s.nativeErrorCode() << ", " << s.driverText()
        << ", " << s.databaseText() << ')';
    return dbg;
}